

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::RegionHandler::handleRemap
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          RegionHandler *this,Vector3d *position,int numberOfChannels)

{
  DenseStorage<double,__1,__1,_1,_0> *other;
  Scalar *pSVar1;
  CoeffReturnType piVar2;
  int i;
  long index;
  VectorXd _pv;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> pv;
  type local_a0;
  undefined8 local_98;
  DenseStorage<double,__1,__1,_1,_0> local_90;
  Scalar local_80;
  optional_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_78;
  ConstantReturnType local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  double local_38;
  
  local_48 = *(undefined4 *)
              (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array;
  uStack_44 = *(undefined4 *)
               ((long)(position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array + 4);
  uStack_40 = *(undefined4 *)
               ((position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array + 1);
  uStack_3c = *(undefined4 *)
               ((long)(position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array + 0xc);
  local_38 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2];
  (**this->_vptr_RegionHandler)(&local_78,this,&local_48);
  if (local_78.m_initialized == true) {
    other = (DenseStorage<double,__1,__1,_1,_0> *)
            boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get
                      ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_78);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_90,other);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
              (&local_60,(long)numberOfChannels);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a0,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_60);
    for (index = 0; index < local_90.m_rows; index = index + 1) {
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_90,
                          index);
      local_80 = *pSVar1;
      piVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)
                          &this->_outputChannels,index);
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_a0,
                          (long)*piVar2);
      *pSVar1 = local_80;
    }
    (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ = local_a0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) = local_98;
    (__return_storage_ptr__->super_type).m_initialized = true;
    free(local_90.m_data);
  }
  else {
    (__return_storage_ptr__->super_type).m_initialized = false;
  }
  boost::optional_detail::optional_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional_base
            (&local_78);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> RegionHandler::handleRemap(
      Eigen::Vector3d position, int numberOfChannels) const {
    boost::optional<Eigen::VectorXd> pv = handle(position);

    if (pv) {
      Eigen::VectorXd _pv = pv.get();
      Eigen::VectorXd out = Eigen::VectorXd::Zero(numberOfChannels);
      for (int i = 0; i < _pv.size(); ++i) {
        out(_outputChannels(i)) = _pv(i);
      }
      return out;
    }
    return boost::none;
  }